

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O1

Qbf_Man_t * Gia_QbfAlloc(Gia_Man_t *pGia,int nPars,int fGlucose,int fVerbose)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  Cnf_Dat_t *p;
  Qbf_Man_t *pQVar5;
  sat_solver *psVar6;
  bmcg_sat_solver *s;
  Vec_Int_t *pVVar7;
  int *piVar8;
  abctime aVar9;
  timespec ts;
  timespec local_40;
  
  iVar3 = pGia->vCos->nSize;
  if (pGia->nRegs < iVar3) {
    if (iVar3 < 1) {
LAB_00795cbb:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar3 = *pGia->vCos->pArray;
    lVar4 = (long)iVar3;
    if ((lVar4 < 0) || (pGia->nObjs <= iVar3)) {
LAB_00795c7d:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar1 = *(ulong *)(pGia->pObjs + lVar4);
    uVar2 = (uint)uVar1;
    if (((int)uVar2 < 0) && ((uVar2 & 0x1fffffff) != 0x1fffffff)) {
      *(ulong *)(pGia->pObjs + lVar4) = uVar1 ^ 0x20000000;
      p = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,1,0,0);
      iVar3 = pGia->vCos->nSize;
      if (iVar3 <= pGia->nRegs) goto LAB_00795c9c;
      if (iVar3 < 1) goto LAB_00795cbb;
      iVar3 = *pGia->vCos->pArray;
      lVar4 = (long)iVar3;
      if ((lVar4 < 0) || (pGia->nObjs <= iVar3)) goto LAB_00795c7d;
      uVar1 = *(ulong *)(pGia->pObjs + lVar4);
      uVar2 = (uint)uVar1;
      if (((int)uVar2 < 0) && ((uVar2 & 0x1fffffff) != 0x1fffffff)) {
        *(ulong *)(pGia->pObjs + lVar4) = uVar1 ^ 0x20000000;
        pQVar5 = (Qbf_Man_t *)calloc(1,0x58);
        iVar3 = clock_gettime(3,&local_40);
        if (iVar3 < 0) {
          aVar9 = -1;
        }
        else {
          aVar9 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        pQVar5->clkStart = aVar9;
        pQVar5->pGia = pGia;
        pQVar5->nPars = nPars;
        iVar3 = pGia->vCis->nSize - pGia->nRegs;
        pQVar5->nVars = iVar3 - nPars;
        pQVar5->fVerbose = fVerbose;
        pQVar5->iParVarBeg = p->nVars - iVar3;
        s = (bmcg_sat_solver *)0x0;
        psVar6 = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
        pQVar5->pSatVer = psVar6;
        psVar6 = sat_solver_new();
        pQVar5->pSatSyn = psVar6;
        if (fGlucose != 0) {
          s = bmcg_sat_solver_start();
        }
        pQVar5->pSatSynG = s;
        iVar3 = pGia->vCis->nSize - pGia->nRegs;
        pVVar7 = (Vec_Int_t *)malloc(0x10);
        if (iVar3 - 1U < 0xf) {
          iVar3 = 0x10;
        }
        pVVar7->nSize = 0;
        pVVar7->nCap = iVar3;
        if (iVar3 == 0) {
          piVar8 = (int *)0x0;
        }
        else {
          piVar8 = (int *)malloc((long)iVar3 << 2);
        }
        pVVar7->pArray = piVar8;
        pQVar5->vValues = pVVar7;
        pVVar7 = (Vec_Int_t *)malloc(0x10);
        iVar3 = 0x10;
        if (0xe < nPars - 1U) {
          iVar3 = nPars;
        }
        pVVar7->nSize = 0;
        pVVar7->nCap = iVar3;
        if (iVar3 == 0) {
          piVar8 = (int *)0x0;
        }
        else {
          piVar8 = (int *)malloc((long)iVar3 * 4);
        }
        pVVar7->pArray = piVar8;
        pVVar7->nSize = nPars;
        if (piVar8 != (int *)0x0) {
          memset(piVar8,0xff,(long)nPars << 2);
        }
        pQVar5->vParMap = pVVar7;
        pVVar7 = (Vec_Int_t *)malloc(0x10);
        pVVar7->nSize = 0;
        pVVar7->nCap = iVar3;
        if (iVar3 == 0) {
          piVar8 = (int *)0x0;
        }
        else {
          piVar8 = (int *)malloc((long)iVar3 << 2);
        }
        pVVar7->pArray = piVar8;
        pQVar5->vLits = pVVar7;
        sat_solver_setnvars(psVar6,nPars);
        if (s != (bmcg_sat_solver *)0x0) {
          bmcg_sat_solver_set_nvars(s,nPars);
        }
        Cnf_DataFree(p);
        return pQVar5;
      }
    }
    __assert_fail("Gia_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x219,"void Gia_ObjFlipFaninC0(Gia_Obj_t *)");
  }
LAB_00795c9c:
  __assert_fail("v < Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
}

Assistant:

Qbf_Man_t * Gia_QbfAlloc( Gia_Man_t * pGia, int nPars, int fGlucose, int fVerbose )
{
    Qbf_Man_t * p;
    Cnf_Dat_t * pCnf;
    Gia_ObjFlipFaninC0( Gia_ManPo(pGia, 0) );
    pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 1, 0, 0 );
    Gia_ObjFlipFaninC0( Gia_ManPo(pGia, 0) );
    p = ABC_CALLOC( Qbf_Man_t, 1 );
    p->clkStart   = Abc_Clock();
    p->pGia       = pGia;
    p->nPars      = nPars;
    p->nVars      = Gia_ManPiNum(pGia) - nPars;
    p->fVerbose   = fVerbose;
    p->iParVarBeg = pCnf->nVars - Gia_ManPiNum(pGia);// - 1;
    p->pSatVer    = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    p->pSatSyn    = sat_solver_new();
    p->pSatSynG   = fGlucose ? bmcg_sat_solver_start() : NULL; 
    p->vValues    = Vec_IntAlloc( Gia_ManPiNum(pGia) );
    p->vParMap    = Vec_IntStartFull( nPars );
    p->vLits      = Vec_IntAlloc( nPars );
    sat_solver_setnvars( p->pSatSyn, nPars );
    if ( p->pSatSynG ) bmcg_sat_solver_set_nvars( p->pSatSynG, nPars );
    Cnf_DataFree( pCnf );
    return p;
}